

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O0

plugin plugin_loader_load(plugin_loader_conflict l,char *name,void *impl,_func_void_plugin *dtor)

{
  char *__ptr;
  char *path;
  plugin_descriptor iface;
  void *in_RSI;
  undefined8 *in_RDI;
  plugin_descriptor descriptor;
  char *symbol_iface_name;
  char *library_name;
  _func_void_plugin *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  plugin_descriptor descriptor_00;
  plugin local_8;
  
  __ptr = plugin_loader_generate_library_name(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (__ptr == (char *)0x0) {
    log_write_impl_va("metacall",0xcc,"plugin_loader_load",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                      ,LOG_LEVEL_ERROR,
                      "Plugin loader from manager \'%s\' failed to allocate the library name for plugin: %s"
                      ,*(undefined8 *)*in_RDI,in_RSI);
    local_8 = (plugin)0x0;
  }
  else {
    path = plugin_loader_generate_symbol_iface_name
                     (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (path == (char *)0x0) {
      log_write_impl_va("metacall",0xd4,"plugin_loader_load",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                        ,LOG_LEVEL_ERROR,
                        "Plugin loader from manager \'%s\' failed to allocate the symbol interface name for plugin: %s"
                        ,*(undefined8 *)*in_RDI,in_RSI);
      free(__ptr);
      local_8 = (plugin)0x0;
    }
    else {
      iface = plugin_descriptor_create(path,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (iface == (plugin_descriptor)0x0) {
        log_write_impl_va("metacall",0xdd,"plugin_loader_load",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                          ,LOG_LEVEL_ERROR,
                          "Plugin loader from manager \'%s\' failed to load plugin: %s",
                          *(undefined8 *)*in_RDI,in_RSI);
        local_8 = (plugin)0x0;
      }
      else {
        descriptor_00 = iface;
        (*iface->iface_singleton)();
        local_8 = plugin_create(path,descriptor_00,iface,in_RSI,in_stack_ffffffffffffffa8);
      }
    }
  }
  return local_8;
}

Assistant:

plugin plugin_loader_load(plugin_loader l, const char *name, void *impl, void (*dtor)(plugin))
{
	char *library_name = plugin_loader_generate_library_name(name, l->library_suffix);

	if (library_name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Plugin loader from manager '%s' failed to allocate the library name for plugin: %s", l->manager->name, name);
		return NULL;
	}

	char *symbol_iface_name = plugin_loader_generate_symbol_iface_name(name, l->symbol_iface_suffix);

	if (symbol_iface_name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Plugin loader from manager '%s' failed to allocate the symbol interface name for plugin: %s", l->manager->name, name);
		free(library_name);
		return NULL;
	}

	plugin_descriptor descriptor = plugin_descriptor_create(l->manager->library_path, library_name, symbol_iface_name);

	if (descriptor == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Plugin loader from manager '%s' failed to load plugin: %s", l->manager->name, name);
		return NULL;
	}

	return plugin_create(name, descriptor, descriptor->iface_singleton(), impl, dtor);
}